

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,double>(double *source,double *target)

{
  bool bVar1;
  
  bVar1 = TryCast::Operation<double,double>(*source,target,false);
  if (!bVar1) {
    *target = *(double *)(&DAT_02102480 + (ulong)(*source <= 0.0 && *source != 0.0) * 8);
  }
  return bVar1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}